

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O0

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromUrl
          (IFilePartLoader *this,URI *url,ClassId classId,bool isAbsolute)

{
  URI *this_00;
  byte in_CL;
  URI *in_RSI;
  long *in_RDI;
  URI absoluteUri;
  String *in_stack_ffffffffffffff10;
  URI *in_stack_ffffffffffffff18;
  URI *in_stack_ffffffffffffff20;
  ClassId in_stack_ffffffffffffff2c;
  URI *in_stack_ffffffffffffff30;
  Loader *in_stack_ffffffffffffff38;
  undefined8 local_8;
  
  if ((in_CL & 1) == 0) {
    this_00 = (URI *)(**(code **)(*in_RDI + 0x58))();
    COLLADABU::URI::getURIString_abi_cxx11_(in_RSI);
    COLLADABU::URI::URI(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10);
    (**(code **)(*in_RDI + 0x38))();
    local_8 = Loader::getUniqueId(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff2c);
    COLLADABU::URI::~URI(this_00);
  }
  else {
    (**(code **)(*in_RDI + 0x38))();
    local_8 = Loader::getUniqueId(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff2c);
  }
  return local_8;
}

Assistant:

const COLLADAFW::UniqueId& IFilePartLoader::createUniqueIdFromUrl( const COLLADABU::URI& url, COLLADAFW::ClassId classId, bool isAbsolute  )
	{
		COLLADABU_ASSERT( getColladaLoader() );

		if ( isAbsolute )
		{
			return getColladaLoader()->getUniqueId(url, classId);
		}
		else
		{
			COLLADABU::URI absoluteUri(getFileUri(), url.getURIString());

			return getColladaLoader()->getUniqueId(absoluteUri, classId);
		}
	}